

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_quad_rule.cc
# Opt level: O3

QuadRule * lf::quad::make_QuadQR_EdgeMidpointRule(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_78;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  VectorXd local_40;
  MatrixXd local_30;
  
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  local_78.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_78,2,4);
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_58,4);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,0)
  ;
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,0)
  ;
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,1)
  ;
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,1)
  ;
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,2)
  ;
  *pSVar1 = 0.5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,2)
  ;
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,0,3)
  ;
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_78,1,3)
  ;
  *pSVar1 = 0.5;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,0);
  *pSVar2 = 0.25;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,1);
  *pSVar2 = 0.25;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,2);
  *pSVar2 = 0.25;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,3);
  *pSVar2 = 0.25;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_78.m_storage.m_data;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_78.m_storage.m_rows;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_78.m_storage.m_cols;
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  local_78.m_storage.m_cols = 0;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_58.m_storage.m_data;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_58.m_storage.m_rows;
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x4,&local_30,&local_40,1);
  free(local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_58.m_storage.m_data);
  free(local_78.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule make_QuadQR_EdgeMidpointRule() {
  Eigen::MatrixXd points(2, 4);
  Eigen::VectorXd weights(4);

  points(0, 0) = 0.5;
  points(1, 0) = 0.0;
  points(0, 1) = 1.0;
  points(1, 1) = 0.5;
  points(0, 2) = 0.5;
  points(1, 2) = 1.0;
  points(0, 3) = 0.0;
  points(1, 3) = 0.5;

  weights(0) = 0.25;
  weights(1) = 0.25;
  weights(2) = 0.25;
  weights(3) = 0.25;

  return QuadRule(base::RefEl::kQuad(), std::move(points), std::move(weights),
                  1);
}